

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O1

bpf_u_int32 ** pcap_nametoaddr(char *name)

{
  uint uVar1;
  uint *puVar2;
  hostent *phVar3;
  bpf_u_int32 **ppbVar4;
  bpf_u_int32 **ppbVar5;
  
  phVar3 = gethostbyname(name);
  if (phVar3 == (hostent *)0x0) {
    ppbVar4 = (bpf_u_int32 **)0x0;
  }
  else {
    ppbVar4 = (bpf_u_int32 **)phVar3->h_addr_list;
    puVar2 = *ppbVar4;
    ppbVar5 = ppbVar4;
    while (puVar2 != (uint *)0x0) {
      ppbVar5 = ppbVar5 + 1;
      uVar1 = *puVar2;
      *puVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar2 = *ppbVar5;
    }
  }
  return ppbVar4;
}

Assistant:

bpf_u_int32 **
pcap_nametoaddr(const char *name)
{
#ifndef h_addr
	static bpf_u_int32 *hlist[2];
#endif
	bpf_u_int32 **p;
	struct hostent *hp;

	if ((hp = gethostbyname(name)) != NULL) {
#ifndef h_addr
		hlist[0] = (bpf_u_int32 *)hp->h_addr;
		NTOHL(hp->h_addr);
		return hlist;
#else
		for (p = (bpf_u_int32 **)hp->h_addr_list; *p; ++p)
			NTOHL(**p);
		return (bpf_u_int32 **)hp->h_addr_list;
#endif
	}
	else
		return 0;
}